

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O3

void __thiscall kpeg::JPEGEncoder::levelShiftComponents(JPEGEncoder *this)

{
  long lVar1;
  Level LVar2;
  uint uVar3;
  Logger *pLVar4;
  ostream *poVar5;
  Level lvl;
  Level lvl_00;
  Image *this_00;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  string local_50;
  
  pLVar4 = Logger::get();
  LVar2 = Logger::getLevel(pLVar4);
  if (0 < (int)LVar2) {
    pLVar4 = Logger::get();
    poVar5 = Logger::getStream(pLVar4);
    Logger::levelStr_abi_cxx11_(&local_50,(Logger *)0x1,lvl);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"[ kpeg:",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Encoder.cpp",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
    *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x199);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ] ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Performing level shift on components...",0x27);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = &this->m_image;
  uVar3 = Image::getHeight(this_00);
  if (uVar3 != 0) {
    uVar8 = 0;
    do {
      uVar3 = Image::getWidth(this_00);
      if (uVar3 != 0) {
        lVar7 = 0;
        uVar6 = 0;
        do {
          Image::getFlPixelPtr(this_00);
          lVar1 = *(long *)(*(long *)local_50._M_dataplus._M_p + uVar8 * 0x18);
          *(float *)(lVar1 + lVar7) = *(float *)(lVar1 + lVar7) + -128.0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length);
          }
          Image::getFlPixelPtr(this_00);
          lVar1 = *(long *)(*(long *)local_50._M_dataplus._M_p + uVar8 * 0x18);
          *(float *)(lVar1 + 4 + lVar7) = *(float *)(lVar1 + 4 + lVar7) + -128.0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length);
          }
          Image::getFlPixelPtr(this_00);
          lVar1 = *(long *)(*(long *)local_50._M_dataplus._M_p + uVar8 * 0x18);
          *(float *)(lVar1 + 8 + lVar7) = *(float *)(lVar1 + 8 + lVar7) + -128.0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length);
          }
          uVar6 = uVar6 + 1;
          uVar3 = Image::getWidth(this_00);
          lVar7 = lVar7 + 0xc;
        } while (uVar6 < uVar3);
      }
      uVar8 = uVar8 + 1;
      uVar3 = Image::getHeight(this_00);
    } while (uVar8 < uVar3);
  }
  pLVar4 = Logger::get();
  LVar2 = Logger::getLevel(pLVar4);
  if (0 < (int)LVar2) {
    pLVar4 = Logger::get();
    poVar5 = Logger::getStream(pLVar4);
    Logger::levelStr_abi_cxx11_(&local_50,(Logger *)0x1,lvl_00);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"[ kpeg:",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Encoder.cpp",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
    *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1a5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ] ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Level shift complete [OK]",0x19);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void JPEGEncoder::levelShiftComponents()
    {
        LOG(Logger::Level::INFO) << "Performing level shift on components..." << std::endl;
        
        for ( int y = 0; y < m_image.getHeight(); ++y )
        {
            for ( int x = 0; x < m_image.getWidth(); ++x )
            {
                (*m_image.getFlPixelPtr())[y][x].comp[YCbCrComponents::Y] -= 128;
                (*m_image.getFlPixelPtr())[y][x].comp[YCbCrComponents::Cb] -= 128;
                (*m_image.getFlPixelPtr())[y][x].comp[YCbCrComponents::Cr] -= 128;
            }
        }
        
        LOG(Logger::Level::INFO) << "Level shift complete [OK]" << std::endl;
        
//         for ( auto&& row : *m_image.getFlPixelPtr() )
//         {
//             for ( auto&& val : row )
//             {
//                 std::cout << val.comp[0] << "," << val.comp[1] << "," << val.comp[2] << "\t";
//             }
//             std::cout << std::endl;
//         }
//         std::cout << std::endl;
    }